

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O3

PClassActor * __thiscall PClassActor::GetReplacee(PClassActor *this,bool lookskill)

{
  undefined1 auVar1 [4];
  PClass *pPVar2;
  PClassActor *pPVar3;
  undefined7 in_register_00000031;
  undefined1 auVar4 [4];
  long lVar5;
  PClassActor *pPVar6;
  undefined1 local_50 [4];
  FName local_4c;
  FName local_48;
  FName local_44;
  FName local_40;
  FName local_3c;
  FName local_38;
  int local_34;
  
  auVar4 = (undefined1  [4])0;
  if (((int)CONCAT71(in_register_00000031,lookskill) != 0) &&
     (auVar4 = (undefined1  [4])0, (uint)gameskill.Value < AllSkills.Count)) {
    local_34 = (this->super_PClass).super_PStruct.super_PNamedType.TypeName.Index;
    FSkillInfo::GetReplacedBy((FSkillInfo *)local_50,&AllSkills.Array[gameskill.Value].Name);
    auVar1 = local_50;
    lVar5 = (long)(int)local_50;
    if (lVar5 != 0) {
      local_38.Index = (int)local_50;
      pPVar2 = PClass::FindClass(&local_38);
      auVar4 = auVar1;
      if (pPVar2 == (PClass *)0x0) {
        Printf("Warning: incorrect actor name in definition of skill %s: \nnon-existent class %s is replaced by class %s\nSkill replacement will be ignored for this actor.\n"
               ,FName::NameData.NameArray[AllSkills.Array[gameskill.Value].Name.Index].Text,
               FName::NameData.NameArray[lVar5].Text,
               FName::NameData.NameArray
               [(this->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text);
        local_3c.Index = (this->super_PClass).super_PStruct.super_PNamedType.TypeName.Index;
        local_40.Index = 0;
        FSkillInfo::SetReplacedBy(AllSkills.Array + gameskill.Value,&local_3c,&local_40);
        local_44.Index = (int)auVar1;
        local_48.Index = 0;
        FSkillInfo::SetReplacement(AllSkills.Array + gameskill.Value,&local_44,&local_48);
        pPVar6 = this->Replacee;
        if (pPVar6 == (PClassActor *)0x0) {
          return this;
        }
        this->Replacee = (PClassActor *)0x0;
        pPVar3 = pPVar6;
        goto LAB_004ee690;
      }
    }
  }
  pPVar6 = this->Replacee;
  pPVar3 = pPVar6;
  if (pPVar6 == (PClassActor *)0x0) {
    if (!lookskill || auVar4 == (undefined1  [4])0x0) {
      return this;
    }
    this->Replacee = (PClassActor *)0x0;
  }
  else {
    this->Replacee = (PClassActor *)0x0;
    if (!lookskill || auVar4 == (undefined1  [4])0x0) goto LAB_004ee690;
  }
  local_4c.Index = (int)auVar4;
  pPVar2 = PClass::FindClass(&local_4c);
  if (pPVar2 != (PClass *)0x0) {
    local_50 = auVar4;
    pPVar2 = PClass::FindClass((FName *)local_50);
    pPVar3 = dyn_cast<PClassActor>((DObject *)pPVar2);
  }
LAB_004ee690:
  pPVar3 = GetReplacee(pPVar3,false);
  this->Replacee = pPVar6;
  return pPVar3;
}

Assistant:

PClassActor *PClassActor::GetReplacee(bool lookskill)
{
	FName skillrepname;
	
	if (lookskill && AllSkills.Size() > (unsigned)gameskill)
	{
		skillrepname = AllSkills[gameskill].GetReplacedBy(TypeName);
		if (skillrepname != NAME_None && PClass::FindClass(skillrepname) == NULL)
		{
			Printf("Warning: incorrect actor name in definition of skill %s: \n"
				   "non-existent class %s is replaced by class %s\n"
				   "Skill replacement will be ignored for this actor.\n", 
				   AllSkills[gameskill].Name.GetChars(), 
				   skillrepname.GetChars(), TypeName.GetChars());
			AllSkills[gameskill].SetReplacedBy(TypeName, NAME_None);
			AllSkills[gameskill].SetReplacement(skillrepname, NAME_None);
			lookskill = false; 
		}
	}
	if (Replacee == NULL && (!lookskill || skillrepname == NAME_None))
	{
		return this;
	}
	// The Replacee field is temporarily NULLed to prevent
	// potential infinite recursion.
	PClassActor *savedrep = Replacee;
	Replacee = NULL;
	PClassActor *rep = savedrep;
	if (lookskill && (skillrepname != NAME_None) && (PClass::FindClass(skillrepname) != NULL))
	{
		rep = PClass::FindActor(skillrepname);
	}
	rep = rep->GetReplacee(false);
	Replacee = savedrep;
	return rep;
}